

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<long,long>::
Flush<duckdb::BitpackingCompressionState<long,true,long>::BitpackingWriter>
          (BitpackingState<long,long> *this)

{
  byte width;
  byte bVar1;
  bitpacking_width_t width_00;
  idx_t iVar2;
  bool bVar3;
  
  bVar3 = true;
  if (*(idx_t *)(this + 0x8810) != 0) {
    if (((this[0x8861] == (BitpackingState<long,long>)0x0) &&
        (*(long *)(this + 0x8830) != *(long *)(this + 0x8828))) ||
       (1 < (byte)((char)this[0x8864] - 1U))) {
      BitpackingState<long,_long>::CalculateFORStats((BitpackingState<long,_long> *)this);
      BitpackingState<long,_long>::CalculateDeltaStats((BitpackingState<long,_long> *)this);
      if (this[0x8862] == (BitpackingState<long,long>)0x1) {
        if ((*(long *)(this + 0x8848) == *(long *)(this + 0x8840)) &&
           (((byte)this[0x8864] & 0xfe) != 4)) {
          BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteConstantDelta
                    (*(long *)(this + 0x8848),**(long **)(this + 0x4008),*(idx_t *)(this + 0x8810),
                     *(long **)(this + 0x4008),(bool *)(this + 0x8010),*(void **)(this + 0x8820));
          *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0x14;
          return true;
        }
        width = BitpackingPrimitives::MinimumBitWidth<long,false>(*(long *)(this + 0x8850));
        bVar1 = BitpackingPrimitives::MinimumBitWidth<long,true>(*(long *)(this + 0x8838));
        if ((width < bVar1) && (this[0x8864] != (BitpackingState<long,long>)0x5)) {
          BitpackingState<long,_long>::SubtractFrameOfReference<long>
                    ((BitpackingState<long,_long> *)this,(long *)(this + 0x4010),
                     *(long *)(this + 0x8840));
          BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteDeltaFor
                    ((long *)(this + 0x4010),(bool *)(this + 0x8010),width,*(long *)(this + 0x8840),
                     *(long *)(this + 0x8858),*(long **)(this + 0x4008),*(idx_t *)(this + 0x8810),
                     *(void **)(this + 0x8820));
          *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0x18;
          iVar2 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x8810),width);
          *(idx_t *)(this + 0x8818) = *(long *)(this + 0x8818) + iVar2;
          return true;
        }
      }
      if (this[0x8863] == (BitpackingState<long,long>)0x1) {
        width_00 = BitpackingPrimitives::MinimumBitWidth<long,false>(*(long *)(this + 0x8838));
        BitpackingState<long,_long>::SubtractFrameOfReference<long>
                  ((BitpackingState<long,_long> *)this,*(long **)(this + 0x4008),
                   *(long *)(this + 0x8828));
        BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteFor
                  (*(long **)(this + 0x4008),(bool *)(this + 0x8010),width_00,
                   *(long *)(this + 0x8828),*(idx_t *)(this + 0x8810),*(void **)(this + 0x8820));
        iVar2 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x8810),width_00);
        *(idx_t *)(this + 0x8818) = iVar2 + *(long *)(this + 0x8818) + 0x10;
      }
      else {
        bVar3 = false;
      }
    }
    else {
      BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteConstant
                (*(long *)(this + 0x8830),*(idx_t *)(this + 0x8810),*(void **)(this + 0x8820),
                 (bool)this[0x8861]);
      *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0xc;
    }
  }
  return bVar3;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}